

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void check_unknown_types<double>(double *value,char *types,char *param_3)

{
  bool bVar1;
  char *pcVar2;
  void *pvVar3;
  Message *message_00;
  double *in_RCX;
  uint __c;
  int iVar4;
  int iVar5;
  AssertionResult gtest_ar;
  allocator local_190 [8];
  char *message;
  char (*local_180) [256];
  string gtest_expected_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char format_str [256];
  
  iVar5 = -0x80000000;
  local_180 = (char (*) [256])value;
  for (iVar4 = -0x80; iVar4 != 0x80; iVar4 = iVar4 + 1) {
    __c = iVar5 >> 0x18;
    pcVar2 = strchr(types,__c);
    if (pcVar2 == (char *)0x0) {
      pvVar3 = memchr(".0123456789}",__c,0xd);
      if (((char)iVar4 != '\0') && (pvVar3 == (void *)0x0)) {
        safe_sprintf<256ul>(&format_str,"{0:10%c}",(ulong)__c);
        message = "invalid type specifier";
        testing::AssertionSuccess();
        if (gtest_ar.success_ == true) {
          std::__cxx11::string::string((string *)&gtest_expected_message,message,local_190);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            fmt::v5::format<char[256],double>(&local_158,(v5 *)format_str,local_180,in_RCX);
            std::__cxx11::string::~string((string *)&local_158);
          }
          testing::AssertionResult::operator<<
                    (&gtest_ar,
                     (char (*) [107])
                     "Expected: format(format_str, value) throws an exception of type format_error.\n  Actual: it throws nothing."
                    );
          std::__cxx11::string::~string((string *)&gtest_expected_message);
        }
        testing::Message::Message((Message *)&gtest_expected_message);
        std::operator<<((ostream *)(gtest_expected_message._M_dataplus._M_p + 0x10),format_str);
        std::operator<<((ostream *)(gtest_expected_message._M_dataplus._M_p + 0x10)," ");
        message_00 = testing::Message::operator<<((Message *)&gtest_expected_message,&message);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        in_RCX = (double *)0x52e;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                   ,0x52e,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_190,message_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_190);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_expected_message);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
    }
    iVar5 = iVar5 + 0x1000000;
  }
  return;
}

Assistant:

void check_unknown_types(const T &value, const char *types, const char *) {
  char format_str[BUFFER_SIZE];
  const char *special = ".0123456789}";
  for (int i = CHAR_MIN; i <= CHAR_MAX; ++i) {
    char c = static_cast<char>(i);
    if (std::strchr(types, c) || std::strchr(special, c) || !c) continue;
    safe_sprintf(format_str, "{0:10%c}", c);
    const char *message = "invalid type specifier";
    EXPECT_THROW_MSG(format(format_str, value), format_error, message)
      << format_str << " " << message;
  }
}